

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linux_joystick.c
# Opt level: O2

GLFWbool pollJoystickEvents(_GLFWjoystickLinux *js)

{
  GLFWbool GVar1;
  undefined8 in_RAX;
  int *piVar2;
  ssize_t sVar3;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  _glfwPollJoystickEvents();
  if (js->present == 0) {
    GVar1 = 0;
  }
  else {
    piVar2 = __errno_location();
    while( true ) {
      *piVar2 = 0;
      sVar3 = read(js->fd,&uStack_28,8);
      if (sVar3 < 0) break;
      if ((uStack_28._6_1_ & 0x7f) == 1) {
        js->buttons[uStack_28._7_1_] = uStack_28._4_2_ != 0;
      }
      else if ((uStack_28._6_1_ & 0x7f) == 2) {
        js->axes[uStack_28._7_1_] = (float)(int)uStack_28._4_2_ / 32767.0;
      }
    }
    if (*piVar2 == 0x13) {
      free(js->axes);
      free(js->buttons);
      free(js->name);
      free(js->path);
      *(undefined8 *)&js->buttonCount = 0;
      js->name = (char *)0x0;
      *(undefined8 *)&js->axisCount = 0;
      js->buttons = (uchar *)0x0;
      js->present = 0;
      js->fd = 0;
      js->axes = (float *)0x0;
      js->path = (char *)0x0;
      _glfwInputJoystickChange((int)((long)(js + -0x7dba) / 0x38),0x40002);
    }
    GVar1 = js->present;
  }
  return GVar1;
}

Assistant:

static GLFWbool pollJoystickEvents(_GLFWjoystickLinux* js)
{
#if defined(__linux__)
    _glfwPollJoystickEvents();

    if (!js->present)
        return GLFW_FALSE;

    // Read all queued events (non-blocking)
    for (;;)
    {
        struct js_event e;

        errno = 0;
        if (read(js->fd, &e, sizeof(e)) < 0)
        {
            // Reset the joystick slot if the device was disconnected
            if (errno == ENODEV)
            {
                free(js->axes);
                free(js->buttons);
                free(js->name);
                free(js->path);

                memset(js, 0, sizeof(_GLFWjoystickLinux));

                _glfwInputJoystickChange(js - _glfw.linux_js.js,
                                         GLFW_DISCONNECTED);
            }

            break;
        }

        // Clear the initial-state bit
        e.type &= ~JS_EVENT_INIT;

        if (e.type == JS_EVENT_AXIS)
            js->axes[e.number] = (float) e.value / 32767.0f;
        else if (e.type == JS_EVENT_BUTTON)
            js->buttons[e.number] = e.value ? GLFW_PRESS : GLFW_RELEASE;
    }
#endif // __linux__
    return js->present;
}